

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O3

void newuhs(boolean incr)

{
  int iVar1;
  schar sVar2;
  boolean bVar3;
  uint uVar4;
  char *pcVar5;
  int *piVar6;
  uint uVar7;
  int iVar8;
  char *line;
  bool bVar9;
  
  uVar4 = u.uhs;
  uVar7 = 0;
  if (((u.uhunger < 0x3e9) && (uVar7 = 1, u.uhunger < 0x97)) && (uVar7 = 2, u.uhunger < 0x33)) {
    uVar7 = (u.uhunger < 1) + 3;
  }
  if ((occupation == eatfood) || ((force_save_hs & 1) != 0)) {
    if ((newuhs_saved_hs & 1) != 0) {
      u.uhs = uVar7;
      return;
    }
    u.uhs = uVar7;
    newuhs_saved_hs = 1;
    newuhs_save_hs = uVar4;
    return;
  }
  if ((newuhs_saved_hs & 1) != 0) {
    u.uhs = newuhs_save_hs;
    newuhs_saved_hs = 0;
  }
  if (uVar7 == 4) {
    uVar7 = u.uhs == 5 | 4;
    bVar9 = true;
    if (3 < u.uhs) {
      iVar8 = (int)((ulong)((long)u.uhunger * -0x66666667) >> 0x20);
      uVar4 = mt_random();
      iVar1 = u.uhunger;
      if (SUB164(ZEXT416(uVar4) % SEXT816((long)(((iVar8 >> 2) - (iVar8 >> 0x1f)) + 0x14)),0) < 0x13
         ) {
        sVar2 = acurr(4);
        if (iVar1 < sVar2 * -0x14 + -200) {
          u.uhs = 6;
          iflags.botl = '\x01';
          bot();
          pline("You die from starvation.");
          killer = "starvation";
          goto LAB_00192289;
        }
        goto LAB_00192060;
      }
      bVar9 = u.uhs != 5;
    }
    if ((bVar9) && (-1 < multi)) {
      stop_occupation();
      pline("You faint from lack of food.");
      flags.soundok = '\0';
      nomul(u.uhunger / 10 + -10,"fainted from lack of food");
      nomovemsg = "You regain consciousness.";
      afternmv = unfaint;
      uVar7 = 5;
    }
  }
LAB_00192060:
  if (uVar7 == u.uhs) {
    return;
  }
  iVar8 = 1;
  if ((2 < uVar7 && u.uhs < 3) || (iVar8 = -1, 2 < u.uhs && uVar7 < 3)) {
    losestr(iVar8,'\x01');
  }
  if (uVar7 == 3) {
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       ((u.umonnum == u.umonster || (bVar3 = dmgtype(youmonst.data,0x24), bVar3 == '\0')))) {
      pcVar5 = "You still have the munchies.";
      line = "The munchies are interfering with your motor capabilities.";
      goto LAB_001921ce;
    }
    if (incr == '\0') {
      line = "You feel weak now.";
LAB_001921db:
      pline(line);
    }
    else {
      if ((1 < (ushort)(urole.malenum - 0x167U)) && (urace.malenum != 0x111)) {
        line = "You are beginning to feel weak.";
        if (u.uhunger < 0x2d) {
          line = "You feel weak.";
        }
        goto LAB_001921db;
      }
      pline("%s needs food, badly!");
    }
    if ((((incr != '\0') && (occupation != opentin)) && (occupation != (_func_int *)0x0)) &&
       (occupation != eatfood)) {
      stop_occupation();
    }
    if ((incr != '\0') && (flags.run != 0)) {
      nomul(0,(char *)0x0);
    }
  }
  else if (uVar7 == 2) {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
      pcVar5 = "You are beginning to feel hungry.";
      if (u.uhunger < 0x91) {
        pcVar5 = "You feel hungry.";
      }
      line = "You only feel hungry now.";
      if (incr != '\0') {
        line = pcVar5;
      }
      goto LAB_001921db;
    }
    pcVar5 = "You now have a lesser case of the munchies.";
    line = "You are getting the munchies.";
LAB_001921ce:
    if (incr == '\0') {
      line = pcVar5;
    }
    goto LAB_001921db;
  }
  iflags.botl = '\x01';
  u.uhs = uVar7;
  bot();
  piVar6 = &u.mh;
  if (u.umonnum == u.umonster) {
    piVar6 = &u.uhp;
  }
  if (0 < *piVar6) {
    return;
  }
  pline("You die from hunger and exhaustion.");
  killer = "exhaustion";
LAB_00192289:
  killer_format = 1;
  done(3);
  return;
}

Assistant:

void newuhs(boolean incr)
{
	unsigned newhs;
	int h = u.uhunger;

	newhs = (h > 1000) ? SATIATED :
		(h > 150) ? NOT_HUNGRY :
		(h > 50) ? HUNGRY :
		(h > 0) ? WEAK : FAINTING;

	/* While you're eating, you may pass from WEAK to HUNGRY to NOT_HUNGRY.
	 * This should not produce the message "you only feel hungry now";
	 * that message should only appear if HUNGRY is an endpoint.  Therefore
	 * we check to see if we're in the middle of eating.  If so, we save
	 * the first hunger status, and at the end of eating we decide what
	 * message to print based on the _entire_ meal, not on each little bit.
	 */
	/* It is normally possible to check if you are in the middle of a meal
	 * by checking occupation == eatfood, but there is one special case:
	 * start_eating() can call bite() for your first bite before it
	 * sets the occupation.
	 * Anyone who wants to get that case to work _without_ an ugly static
	 * force_save_hs variable, feel free.
	 */
	/* Note: If you become a certain hunger status in the middle of the
	 * meal, and still have that same status at the end of the meal,
	 * this will incorrectly print the associated message at the end of
	 * the meal instead of the middle.  Such a case is currently
	 * impossible, but could become possible if a message for SATIATED
	 * were added or if HUNGRY and WEAK were separated by a big enough
	 * gap to fit two bites.
	 */
	if (occupation == eatfood || force_save_hs) {
		if (!newuhs_saved_hs) {
			newuhs_save_hs = u.uhs;
			newuhs_saved_hs = TRUE;
		}
		u.uhs = newhs;
		return;
	} else {
		if (newuhs_saved_hs) {
			u.uhs = newuhs_save_hs;
			newuhs_saved_hs = FALSE;
		}
	}

	if (newhs == FAINTING) {
		if (is_fainted()) newhs = FAINTED;
		if (u.uhs <= WEAK || rn2(20-u.uhunger/10) >= 19) {
			if (!is_fainted() && multi >= 0 /* %% */) {
				/* stop what you're doing, then faint */
				stop_occupation();
				pline("You faint from lack of food.");
				flags.soundok = 0;
				nomul(-10+(u.uhunger/10), "fainted from lack of food");
				nomovemsg = "You regain consciousness.";
				afternmv = unfaint;
				newhs = FAINTED;
			}
		} else
		if (u.uhunger < -(int)(200 + 20*ACURR(A_CON))) {
			u.uhs = STARVED;
			iflags.botl = 1;
			bot();
			pline("You die from starvation.");
			killer_format = KILLED_BY;
			killer = "starvation";
			done(STARVING);
			/* if we return, we lifesaved, and that calls newuhs */
			return;
		}
	}

	if (newhs != u.uhs) {
		if (newhs >= WEAK && u.uhs < WEAK)
			losestr(1, TRUE);	/* this may kill you -- see below */
		else if (newhs < WEAK && u.uhs >= WEAK)
			losestr(-1, TRUE);
		switch(newhs){
		case HUNGRY:
			if (Hallucination) {
			    pline((!incr) ?
				"You now have a lesser case of the munchies." :
				"You are getting the munchies.");
			} else
			    pline((!incr) ? "You only feel hungry now." :
				  (u.uhunger < 145) ? "You feel hungry." :
				   "You are beginning to feel hungry.");
			if (incr && occupation &&
			    (occupation != eatfood && occupation != opentin))
			    stop_occupation();
			if (incr && flags.run)
			    nomul(0, NULL);
			break;
		case WEAK:
			if (Hallucination)
			    pline((!incr) ?
				  "You still have the munchies." :
      "The munchies are interfering with your motor capabilities.");
			else if (incr &&
				(Role_if (PM_WIZARD) || Race_if(PM_ELF) ||
				 Role_if (PM_VALKYRIE)))
			    pline("%s needs food, badly!",
				  (Role_if (PM_WIZARD) || Role_if(PM_VALKYRIE)) ?
				  urole.name.m : "Elf");
			else
			    pline((!incr) ? "You feel weak now." :
				  (u.uhunger < 45) ? "You feel weak." :
				   "You are beginning to feel weak.");
			if (incr && occupation &&
			    (occupation != eatfood && occupation != opentin))
			    stop_occupation();
			if (incr && flags.run)
			    nomul(0, NULL);
			break;
		}
		u.uhs = newhs;
		iflags.botl = 1;
		bot();
		if ((Upolyd ? u.mh : u.uhp) < 1) {
			pline("You die from hunger and exhaustion.");
			killer_format = KILLED_BY;
			killer = "exhaustion";
			done(STARVING);
			return;
		}
	}
}